

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-blob.cpp
# Opt level: O1

ShaderLibraryHandle __thiscall
nvrhi::createShaderLibraryPermutation
          (nvrhi *this,IDevice *device,void *blob,size_t blobSize,ShaderConstant *constants,
          uint32_t numConstants,bool errorIfNotFound)

{
  bool bVar1;
  long *plVar2;
  size_t *pSize;
  size_t binarySize;
  void *binary;
  string message;
  size_t local_60;
  void *local_58;
  string local_50;
  
  local_58 = (void *)0x0;
  pSize = &local_60;
  local_60 = 0;
  bVar1 = findPermutationInBlob(blob,blobSize,constants,numConstants,&local_58,pSize);
  if (bVar1) {
    (**(code **)(*(long *)device + 0xa8))(this,device,local_58,local_60);
  }
  else {
    if (errorIfNotFound) {
      formatShaderNotFoundMessage_abi_cxx11_
                (&local_50,(nvrhi *)blob,(void *)blobSize,(size_t)constants,
                 (ShaderConstant *)(ulong)numConstants,(uint32_t)pSize);
      plVar2 = (long *)(**(code **)(*(long *)device + 0x1b8))(device);
      (**(code **)(*plVar2 + 0x10))(plVar2,2,local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    *(undefined8 *)this = 0;
  }
  return (ShaderLibraryHandle)(InterfaceType *)this;
}

Assistant:

ShaderLibraryHandle createShaderLibraryPermutation(IDevice* device, const void* blob, size_t blobSize,
        const ShaderConstant* constants, uint32_t numConstants, bool errorIfNotFound)
    {
        const void* binary = nullptr;
        size_t binarySize = 0;

        if (findPermutationInBlob(blob, blobSize, constants, numConstants, &binary, &binarySize))
        {
            return device->createShaderLibrary(binary, binarySize);
        }

        if (errorIfNotFound)
        {
            std::string message = formatShaderNotFoundMessage(blob, blobSize, constants, numConstants);
            device->getMessageCallback()->message(MessageSeverity::Error, message.c_str());
        }

        return nullptr;
    }